

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttt.cpp
# Opt level: O0

int GetStatus(TBoard *board)

{
  value_type_conflict4 vVar1;
  const_reference pvVar2;
  byte *pbVar3;
  int j;
  int i_1;
  int i;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_1c;
  int local_18;
  int local_14;
  uint local_4;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    vVar1 = *pvVar2;
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (vVar1 == *pvVar2) {
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      vVar1 = *pvVar2;
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (vVar1 == *pvVar2) {
        std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                  ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                           ((array<unsigned_char,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 != '\0') {
          std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                    ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
          pbVar3 = std::array<unsigned_char,_3UL>::operator[]
                             ((array<unsigned_char,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          return (uint)*pbVar3;
        }
      }
    }
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    vVar1 = *pvVar2;
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (vVar1 == *pvVar2) {
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      vVar1 = *pvVar2;
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (vVar1 == *pvVar2) {
        std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                  ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                           ((array<unsigned_char,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 != '\0') {
          std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                    ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
          pbVar3 = std::array<unsigned_char,_3UL>::operator[]
                             ((array<unsigned_char,_3UL> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          return (uint)*pbVar3;
        }
      }
    }
  }
  std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
            ((array<std::array<unsigned_char,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                     ((array<unsigned_char,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  vVar1 = *pvVar2;
  std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
            ((array<std::array<unsigned_char,_3UL>,_3UL> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                     ((array<unsigned_char,_3UL> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  if (vVar1 == *pvVar2) {
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    vVar1 = *pvVar2;
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (vVar1 != *pvVar2) goto LAB_0024d6c0;
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (*pvVar2 == '\0') goto LAB_0024d6c0;
LAB_0024d780:
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pbVar3 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    local_4 = (uint)*pbVar3;
  }
  else {
LAB_0024d6c0:
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    vVar1 = *pvVar2;
    std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
              ((array<std::array<unsigned_char,_3UL>,_3UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                       ((array<unsigned_char,_3UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (vVar1 == *pvVar2) {
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      pbVar3 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc4 = (uint)*pbVar3;
      std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                 (ulong)CONCAT14(*pbVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      pbVar3 = std::array<unsigned_char,_3UL>::operator[]
                         ((array<unsigned_char,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (in_stack_ffffffffffffffc4 == *pbVar3) {
        std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                  ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                           ((array<unsigned_char,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 != '\0') goto LAB_0024d780;
      }
    }
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        std::array<std::array<unsigned_char,_3UL>,_3UL>::operator[]
                  ((array<std::array<unsigned_char,_3UL>,_3UL> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
        pvVar2 = std::array<unsigned_char,_3UL>::operator[]
                           ((array<unsigned_char,_3UL> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (*pvVar2 == '\0') {
          return -1;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
GetStatus(const ttt::TBoard &board)
{

    for (int i = 0; i < 3; ++i)
    {
        if (board[i][1] == board[i][0] && board[i][1] == board[i][2] && board[i][1] != 0)
            return board[i][1];
        if (board[1][i] == board[0][i] && board[1][i] == board[2][i] && board[1][i] != 0)
            return board[1][i];
    }
    if ((board[1][1] == board[0][0] && board[1][1] == board[2][2] && board[1][1] != 0) || (board[1][1] == board[0][2] && board[1][1] == board[2][0] && board[1][1] != 0))
        return board[1][1];
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            if (board[i][j] == 0)
                return game::Undecided;
    return game::Draw;
}